

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

char * __thiscall
spirv_cross::CompilerHLSL::to_storage_qualifiers_glsl(CompilerHLSL *this,SPIRVariable *var)

{
  if ((var->storage < AtomicCounter) && ((0x205U >> (var->storage & 0x1f) & 1) != 0)) {
    return "uniform ";
  }
  return "";
}

Assistant:

const char *CompilerHLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	// Input and output variables are handled specially in HLSL backend.
	// The variables are declared as global, private variables, and do not need any qualifiers.
	if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	    var.storage == StorageClassPushConstant)
	{
		return "uniform ";
	}

	return "";
}